

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O0

bool xmrig::NvmlLib::dlopen(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool local_1;
  
  bVar1 = String::isNull((String *)m_loader);
  if (bVar1) {
    iVar2 = uv_dlopen("libnvidia-ml.so",nvmlLib);
  }
  else {
    pcVar3 = String::operator_cast_to_char_((String *)m_loader);
    iVar2 = uv_dlopen(pcVar3,nvmlLib);
  }
  local_1 = iVar2 == 0;
  return local_1;
}

Assistant:

bool xmrig::NvmlLib::dlopen()
{
    if (!m_loader.isNull()) {
        return uv_dlopen(m_loader, &nvmlLib) == 0;
    }

#   ifdef _WIN32
    if (uv_dlopen("nvml.dll", &nvmlLib) == 0) {
        return true;
    }

    char path[MAX_PATH] = { 0 };
    ExpandEnvironmentStringsA("%PROGRAMFILES%\\NVIDIA Corporation\\NVSMI\\nvml.dll", path, sizeof(path));

    return uv_dlopen(path, &nvmlLib) == 0;
#   else
    return uv_dlopen("libnvidia-ml.so", &nvmlLib) == 0;
#   endif
}